

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoringtable_test.cpp
# Opt level: O0

Utest * __thiscall
TEST_ScoringTableTest_DealerWinByDiscard_ManganOrMore_TestShell::createTest
          (TEST_ScoringTableTest_DealerWinByDiscard_ManganOrMore_TestShell *this)

{
  TEST_ScoringTableTest_DealerWinByDiscard_ManganOrMore_Test *this_00;
  char *in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  TEST_ScoringTableTest_DealerWinByDiscard_ManganOrMore_TestShell *this_local;
  
  this_00 = (TEST_ScoringTableTest_DealerWinByDiscard_ManganOrMore_Test *)
            operator_new(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,0);
  TEST_ScoringTableTest_DealerWinByDiscard_ManganOrMore_Test::
  TEST_ScoringTableTest_DealerWinByDiscard_ManganOrMore_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(ScoringTableTest, DealerWinByDiscard_ManganOrMore)
{
	CHECK_EQUAL(12000, t.dealerWinByDiscard(3, 70));
	CHECK_EQUAL(12000, t.dealerWinByDiscard(4, 40));
	CHECK_EQUAL(12000, t.dealerWinByDiscard(4, 70));
	CHECK_EQUAL(12000, t.dealerWinByDiscard(5, 0));

	CHECK_EQUAL(18000, t.dealerWinByDiscard(6, 0));
	CHECK_EQUAL(18000, t.dealerWinByDiscard(7, 0));

	CHECK_EQUAL(24000, t.dealerWinByDiscard(8, 0));
	CHECK_EQUAL(24000, t.dealerWinByDiscard(9, 0));
	CHECK_EQUAL(24000, t.dealerWinByDiscard(10, 0));

	CHECK_EQUAL(36000, t.dealerWinByDiscard(11, 0));
	CHECK_EQUAL(36000, t.dealerWinByDiscard(12, 0));

	CHECK_EQUAL(48000, t.dealerWinByDiscard(13, 0));
}